

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastPower(Gia_Man_t *pNew,int *pNum,int nNum,int *pExp,int nExp,Vec_Int_t *vTemp,
                   Vec_Int_t *vRes)

{
  int *pArg0;
  int *piVar1;
  int iVar2;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  ulong uVar3;
  ulong uVar4;
  int *pArray;
  ulong uVar5;
  ulong uVar6;
  int *local_70;
  
  p = Vec_IntAlloc(nNum * 2);
  p_00 = Vec_IntAlloc(nNum * 2);
  pArg0 = vRes->pArray;
  piVar1 = p_00->pArray;
  uVar5 = 0;
  Vec_IntFill(vRes,nNum,0);
  Vec_IntWriteEntry(vRes,0,1);
  uVar4 = 0;
  if (0 < nNum) {
    uVar4 = (ulong)(uint)nNum;
  }
  uVar3 = (ulong)(uint)nExp;
  if (nExp < 1) {
    uVar3 = uVar5;
  }
  local_70 = (int *)0x0;
  for (; uVar5 != uVar3; uVar5 = uVar5 + 1) {
    pArray = pNum;
    if (uVar5 != 0) {
      Wlc_BlastMultiplier2(pNew,local_70,local_70,nNum,vTemp,p_00);
      pArray = piVar1;
    }
    local_70 = Wlc_VecCopy(p,pArray,nNum);
    Wlc_BlastMultiplier2(pNew,pArg0,local_70,nNum,vTemp,p_00);
    for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      iVar2 = Gia_ManHashMux(pNew,pExp[uVar5],piVar1[uVar6],pArg0[uVar6]);
      pArg0[uVar6] = iVar2;
    }
  }
  Vec_IntFree(p_00);
  Vec_IntFree(p);
  return;
}

Assistant:

void Wlc_BlastPower( Gia_Man_t * pNew, int * pNum, int nNum, int * pExp, int nExp, Vec_Int_t * vTemp, Vec_Int_t * vRes )
{
    Vec_Int_t * vDegrees = Vec_IntAlloc( 2*nNum );
    Vec_Int_t * vResTemp = Vec_IntAlloc( 2*nNum );
    int i, * pDegrees = NULL, * pRes = Vec_IntArray(vRes);
    int k, * pResTemp = Vec_IntArray(vResTemp);
    Vec_IntFill( vRes, nNum, 0 );
    Vec_IntWriteEntry( vRes, 0, 1 );
    for ( i = 0; i < nExp; i++ )
    {
        if ( i == 0 )
            pDegrees = Wlc_VecCopy( vDegrees, pNum, nNum );
        else
        {
            Wlc_BlastMultiplier2( pNew, pDegrees, pDegrees, nNum, vTemp, vResTemp );
            pDegrees = Wlc_VecCopy( vDegrees, pResTemp, nNum );
        }
        Wlc_BlastMultiplier2( pNew, pRes, pDegrees, nNum, vTemp, vResTemp );
        for ( k = 0; k < nNum; k++ )
            pRes[k] = Gia_ManHashMux( pNew, pExp[i], pResTemp[k], pRes[k] );
    }
    Vec_IntFree( vResTemp );
    Vec_IntFree( vDegrees );
}